

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeutils.cpp
# Opt level: O3

frame * read_frame_from_pipe(frame *__return_storage_ptr__,pipestruct p)

{
  string f_str;
  string local_58;
  string local_38;
  
  read_pipe_abi_cxx11_(&local_38,p);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,local_38._M_dataplus._M_p,
             local_38._M_dataplus._M_p + local_38._M_string_length);
  frame_from_string(__return_storage_ptr__,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

frame read_frame_from_pipe(pipestruct p) {
	string f_str = read_pipe(p);
	return frame_from_string(f_str);
}